

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O2

void move(int *x,int *y,int dir)

{
  switch(dir) {
  case 0:
    *y = *y + -1;
    return;
  case 1:
    *x = *x + 1;
    return;
  case 2:
    *y = *y + 1;
    return;
  case 3:
    *x = *x + -1;
    return;
  default:
    panic("move: bad direction");
  }
}

Assistant:

static void move(int *x, int *y, int dir)
{
	switch(dir){
		case 0: --(*y); break;
		case 1: (*x)++; break;
		case 2: (*y)++; break;
		case 3: --(*x); break;
		default: panic("move: bad direction");
	}
}